

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

bool re2::ParseEscape(StringPiece *s,Rune *rp,RegexpStatus *status,int rune_max)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Rune c1;
  uint local_40;
  uint local_3c;
  int local_38;
  int local_34;
  
  iVar4 = s->length_;
  if ((iVar4 < 1) || (pcVar2 = s->ptr_, *pcVar2 != '\\')) {
    status->code_ = kRegexpInternalError;
LAB_00112682:
    (status->error_arg_).ptr_ = (char *)0x0;
    (status->error_arg_).length_ = 0;
    return false;
  }
  if (iVar4 == 1) {
    status->code_ = kRegexpTrailingBackslash;
    goto LAB_00112682;
  }
  s->ptr_ = pcVar2 + 1;
  s->length_ = iVar4 + -1;
  iVar4 = StringPieceToRune((Rune *)&local_40,s,status);
  if (iVar4 < 0) {
    return false;
  }
  if (6 < local_40 - 0x31) {
    switch(local_40) {
    case 0x6e:
      *rp = 10;
      break;
    case 0x72:
      *rp = 0xd;
      break;
    case 0x74:
      *rp = 9;
      break;
    case 0x76:
      *rp = 0xb;
      break;
    case 0x78:
      if (s->length_ != 0) {
        iVar4 = StringPieceToRune((Rune *)&local_40,s,status);
        if (iVar4 < 0) {
          return false;
        }
        if (local_40 == 0x7b) {
          iVar4 = StringPieceToRune((Rune *)&local_40,s,status);
          local_38 = 0;
          if (iVar4 < 0) {
            return false;
          }
          iVar4 = 0;
          while ((0xfffffff5 < local_40 - 0x3a || (0xfffffff9 < (local_40 & 0xffffffdf) - 0x47))) {
            local_34 = iVar4 << 4;
            iVar4 = UnHex(local_40);
            iVar4 = iVar4 + local_34;
            if ((rune_max < iVar4) || (s->length_ == 0)) goto LAB_0011292f;
            iVar5 = StringPieceToRune((Rune *)&local_40,s,status);
            local_38 = local_38 + -1;
            if (iVar5 < 0) {
              return false;
            }
          }
          if (local_38 != 0 && local_40 == 0x7d) {
            *rp = iVar4;
            return true;
          }
        }
        else if (s->length_ != 0) {
          iVar4 = StringPieceToRune((Rune *)&local_3c,s,status);
          if (iVar4 < 0) {
            return false;
          }
          if (((0xfffffff5 < local_40 - 0x3a) || (0xfffffff9 < (local_40 & 0xffffffdf) - 0x47)) &&
             ((0xfffffff5 < local_3c - 0x3a || (0xfffffff9 < (local_3c & 0xffffffdf) - 0x47)))) {
            iVar4 = UnHex(local_40);
            uVar6 = UnHex(local_3c);
            *rp = uVar6 | iVar4 << 4;
            return true;
          }
        }
      }
      goto LAB_0011292f;
    default:
      if (local_40 == 0x66) {
        *rp = 0xc;
        return true;
      }
      if (local_40 == 0x61) {
        *rp = 7;
        return true;
      }
      if (local_40 == 0x30) {
        iVar4 = s->length_;
        goto LAB_00112733;
      }
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
      if (((0x7f < (int)local_40) || (iVar4 = isalpha(local_40), local_40 - 0x30 < 10)) ||
         (iVar4 != 0)) {
LAB_0011292f:
        status->code_ = kRegexpBadEscape;
        iVar4 = *(int *)&s->ptr_;
        (status->error_arg_).ptr_ = pcVar2;
        (status->error_arg_).length_ = iVar4 - (int)pcVar2;
        return false;
      }
LAB_00112798:
      *rp = local_40;
    }
    return true;
  }
  iVar4 = s->length_;
  if ((iVar4 == 0) || ((byte)(*s->ptr_ - 0x38U) < 0xf8)) goto LAB_0011292f;
LAB_00112733:
  local_40 = local_40 - 0x30;
  if (0 < iVar4) {
    pbVar3 = (byte *)s->ptr_;
    if ((*pbVar3 & 0xf8) == 0x30) {
      local_40 = ((int)(char)*pbVar3 + local_40 * 8) - 0x30;
      s->ptr_ = (char *)(pbVar3 + 1);
      s->length_ = iVar4 + -1;
      if ((iVar4 + -1 != 0) && (bVar1 = pbVar3[1], (bVar1 & 0xf8) == 0x30)) {
        local_40 = ((uint)bVar1 + local_40 * 8) - 0x30;
        s->ptr_ = (char *)(pbVar3 + 2);
        s->length_ = iVar4 + -2;
      }
    }
  }
  if (rune_max < (int)local_40) goto LAB_0011292f;
  goto LAB_00112798;
}

Assistant:

static bool ParseEscape(StringPiece* s, Rune* rp,
                        RegexpStatus* status, int rune_max) {
  const char* begin = s->begin();
  if (s->size() < 1 || (*s)[0] != '\\') {
    // Should not happen - caller always checks.
    status->set_code(kRegexpInternalError);
    status->set_error_arg(NULL);
    return false;
  }
  if (s->size() < 2) {
    status->set_code(kRegexpTrailingBackslash);
    status->set_error_arg(NULL);
    return false;
  }
  Rune c, c1;
  s->remove_prefix(1);  // backslash
  if (StringPieceToRune(&c, s, status) < 0)
    return false;
  int code;
  switch (c) {
    default:
      if (c < Runeself && !isalpha(c) && !isdigit(c)) {
        // Escaped non-word characters are always themselves.
        // PCRE is not quite so rigorous: it accepts things like
        // \q, but we don't.  We once rejected \_, but too many
        // programs and people insist on using it, so allow \_.
        *rp = c;
        return true;
      }
      goto BadEscape;

    // Octal escapes.
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
      // Single non-zero octal digit is a backreference; not supported.
      if (s->size() == 0 || (*s)[0] < '0' || (*s)[0] > '7')
        goto BadEscape;
      // fall through
    case '0':
      // consume up to three octal digits; already have one.
      code = c - '0';
      if (s->size() > 0 && '0' <= (c = (*s)[0]) && c <= '7') {
        code = code * 8 + c - '0';
        s->remove_prefix(1);  // digit
        if (s->size() > 0) {
          c = (*s)[0];
          if ('0' <= c && c <= '7') {
            code = code * 8 + c - '0';
            s->remove_prefix(1);  // digit
          }
        }
      }
      if (code > rune_max)
        goto BadEscape;
      *rp = code;
      return true;

    // Hexadecimal escapes
    case 'x':
      if (s->size() == 0)
        goto BadEscape;
      if (StringPieceToRune(&c, s, status) < 0)
        return false;
      if (c == '{') {
        // Any number of digits in braces.
        // Update n as we consume the string, so that
        // the whole thing gets shown in the error message.
        // Perl accepts any text at all; it ignores all text
        // after the first non-hex digit.  We require only hex digits,
        // and at least one.
        if (StringPieceToRune(&c, s, status) < 0)
          return false;
        int nhex = 0;
        code = 0;
        while (IsHex(c)) {
          nhex++;
          code = code * 16 + UnHex(c);
          if (code > rune_max)
            goto BadEscape;
          if (s->size() == 0)
            goto BadEscape;
          if (StringPieceToRune(&c, s, status) < 0)
            return false;
        }
        if (c != '}' || nhex == 0)
          goto BadEscape;
        *rp = code;
        return true;
      }
      // Easy case: two hex digits.
      if (s->size() == 0)
        goto BadEscape;
      if (StringPieceToRune(&c1, s, status) < 0)
        return false;
      if (!IsHex(c) || !IsHex(c1))
        goto BadEscape;
      *rp = UnHex(c) * 16 + UnHex(c1);
      return true;

    // C escapes.
    case 'n':
      *rp = '\n';
      return true;
    case 'r':
      *rp = '\r';
      return true;
    case 't':
      *rp = '\t';
      return true;

    // Less common C escapes.
    case 'a':
      *rp = '\a';
      return true;
    case 'f':
      *rp = '\f';
      return true;
    case 'v':
      *rp = '\v';
      return true;

    // This code is disabled to avoid misparsing
    // the Perl word-boundary \b as a backspace
    // when in POSIX regexp mode.  Surprisingly,
    // in Perl, \b means word-boundary but [\b]
    // means backspace.  We don't support that:
    // if you want a backspace embed a literal
    // backspace character or use \x08.
    //
    // case 'b':
    //   *rp = '\b';
    //   return true;
  }

  LOG(DFATAL) << "Not reached in ParseEscape.";

BadEscape:
  // Unrecognized escape sequence.
  status->set_code(kRegexpBadEscape);
  status->set_error_arg(
      StringPiece(begin, static_cast<int>(s->data() - begin)));
  return false;
}